

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# express_node.cpp
# Opt level: O2

bool __thiscall front::express::ExpressNode::isBinaryOperation(ExpressNode *this)

{
  return this->_operation - PLUS < 0xd;
}

Assistant:

bool ExpressNode::isBinaryOperation() {
  return _operation == OperationType::PLUS ||
         _operation == OperationType::MINU ||
         _operation == OperationType::MUL || _operation == OperationType::DIV ||
         _operation == OperationType::MOD || _operation == OperationType::OR ||
         _operation == OperationType::AND || _operation == OperationType::EQL ||
         _operation == OperationType::NEQ || _operation == OperationType::LSS ||
         _operation == OperationType::LEQ || _operation == OperationType::GEQ ||
         _operation == OperationType::GRE;
}